

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void whereCheckIfBloomFilterIsUseful(WhereInfo *pWInfo)

{
  byte bVar1;
  uint uVar2;
  SrcList *pSVar3;
  long lVar4;
  Table *pTVar5;
  long lVar6;
  short sVar7;
  
  bVar1 = pWInfo->nLevel;
  if ((ulong)bVar1 != 0) {
    pSVar3 = pWInfo->pTabList;
    lVar6 = 0;
    sVar7 = 0;
    do {
      lVar4 = *(long *)((long)&pWInfo->a[0].pWLoop + lVar6);
      pTVar5 = pSVar3->a[*(byte *)(lVar4 + 0x10)].pSTab;
      if ((pTVar5->tabFlags & 0x10) == 0) {
        return;
      }
      pTVar5->tabFlags = pTVar5->tabFlags | 0x100;
      if (((lVar6 != 0) &&
          (uVar2 = *(uint *)(lVar4 + 0x30), (uVar2 & 0x300) != 0 && (~uVar2 & 0x800001) == 0)) &&
         (pTVar5->nRowLogEst < sVar7)) {
        *(uint *)(lVar4 + 0x30) = uVar2 & 0xffbfffbf | 0x400000;
      }
      sVar7 = sVar7 + *(short *)(lVar4 + 0x16);
      lVar6 = lVar6 + 0x70;
    } while ((ulong)bVar1 * 0x70 - lVar6 != 0);
  }
  return;
}

Assistant:

static SQLITE_NOINLINE void whereCheckIfBloomFilterIsUseful(
  const WhereInfo *pWInfo
){
  int i;
  LogEst nSearch = 0;

  assert( pWInfo->nLevel>=2 );
  assert( OptimizationEnabled(pWInfo->pParse->db, SQLITE_BloomFilter) );
  for(i=0; i<pWInfo->nLevel; i++){
    WhereLoop *pLoop = pWInfo->a[i].pWLoop;
    const unsigned int reqFlags = (WHERE_SELFCULL|WHERE_COLUMN_EQ);
    SrcItem *pItem = &pWInfo->pTabList->a[pLoop->iTab];
    Table *pTab = pItem->pSTab;
    if( (pTab->tabFlags & TF_HasStat1)==0 ) break;
    pTab->tabFlags |= TF_MaybeReanalyze;
    if( i>=1
     && (pLoop->wsFlags & reqFlags)==reqFlags
     /* vvvvvv--- Always the case if WHERE_COLUMN_EQ is defined */
     && ALWAYS((pLoop->wsFlags & (WHERE_IPK|WHERE_INDEXED))!=0)
    ){
      if( nSearch > pTab->nRowLogEst ){
        testcase( pItem->fg.jointype & JT_LEFT );
        pLoop->wsFlags |= WHERE_BLOOMFILTER;
        pLoop->wsFlags &= ~WHERE_IDX_ONLY;
        WHERETRACE(0xffffffff, (
           "-> use Bloom-filter on loop %c because there are ~%.1e "
           "lookups into %s which has only ~%.1e rows\n",
           pLoop->cId, (double)sqlite3LogEstToInt(nSearch), pTab->zName,
           (double)sqlite3LogEstToInt(pTab->nRowLogEst)));
      }
    }
    nSearch += pLoop->nOut;
  }
}